

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86_fma::create_pipeline_int8_x86(Convolution_x86_fma *this,Option *opt)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  undefined8 *puVar4;
  byte *in_RSI;
  long in_RDI;
  float scale_in;
  int p;
  bool prefer_winograd;
  int num_input;
  int maxk;
  Option *in_stack_00000158;
  int in_stack_00000160;
  int in_stack_00000164;
  Mat *in_stack_00000168;
  Mat *in_stack_00000170;
  int in_stack_00000258;
  int in_stack_0000025c;
  int in_stack_00000260;
  int in_stack_00000264;
  int in_stack_00000268;
  int in_stack_0000026c;
  Mat *in_stack_00000270;
  Mat *in_stack_00000278;
  Option *in_stack_000005b0;
  Allocator *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float fVar6;
  int local_78;
  
  uVar3 = (long)*(int *)(in_RDI + 0x104) / (long)(*(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8))
  ;
  if ((((in_RSI[0x37] & 1) != 0) || (uVar5 = false, (in_RSI[0x38] & 1) != 0)) &&
     (in_stack_ffffffffffffff76 = true, uVar5 = in_stack_ffffffffffffff76,
     (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
          (long)*(int *)(in_RDI + 0xd0)) < 9)) {
    in_stack_ffffffffffffff76 = 8 < *(int *)(in_RDI + 0xd0);
    uVar5 = in_stack_ffffffffffffff76;
  }
  if ((((((in_RSI[0x1c] & 1) == 0) || ((bool)uVar5 == false)) ||
       ((*(int *)(in_RDI + 0xd4) != 3 ||
        ((*(int *)(in_RDI + 0xd8) != 3 || (*(int *)(in_RDI + 0xdc) != 1)))))) ||
      (*(int *)(in_RDI + 0xe0) != 1)) ||
     ((*(int *)(in_RDI + 0xe4) != 1 || (*(int *)(in_RDI + 0xe8) != 1)))) {
    if ((in_RSI[0x1d] & 1) == 0) {
      convolution_transform_kernel_packed_int8
                (in_stack_00000270,(Mat *)CONCAT44(in_stack_0000026c,in_stack_00000268),
                 in_stack_00000264,in_stack_00000260,in_stack_0000025c,in_stack_00000258);
    }
    else {
      convolution_im2col_gemm_transform_kernel_int8
                (in_stack_00000278,in_stack_00000270,in_stack_0000026c,in_stack_00000268,
                 in_stack_00000264,in_stack_00000260,in_stack_000005b0);
    }
  }
  else if ((in_RSI[0x38] & 1) == 0) {
    conv3x3s1_winograd23_transform_kernel_int8
              (in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000160,
               in_stack_00000158);
  }
  else {
    conv3x3s1_winograd43_transform_kernel_int8
              (in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000160,
               in_stack_00000158);
  }
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              (int)((ulong)in_RDI >> 0x20),
              CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
              in_stack_ffffffffffffff68);
  for (local_78 = 0; local_78 < *(int *)(in_RDI + 0xd0); local_78 = local_78 + 1) {
    fVar6 = *(float *)(*(long *)(in_RDI + 0x1f0) + (long)local_78 * 4);
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      fVar6 = 1.0 / (**(float **)(in_RDI + 0x238) *
                    *(float *)(*(long *)(in_RDI + 0x1f0) + (long)local_78 * 4));
    }
    else {
      fVar6 = 0.0;
    }
    *(float *)(*(long *)(in_RDI + 0x448) + (long)local_78 * 4) = fVar6;
  }
  if ((*in_RSI & 1) != 0) {
    puVar4 = (undefined8 *)(in_RDI + 0x160);
    if (*(long *)(in_RDI + 0x168) != 0) {
      piVar2 = *(int **)(in_RDI + 0x168);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x180) == 0) {
          if ((void *)*puVar4 != (void *)0x0) {
            free((void *)*puVar4);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))(*(long **)(in_RDI + 0x180),*puVar4);
        }
      }
    }
    *puVar4 = 0;
    puVar4[2] = 0;
    *(undefined4 *)(puVar4 + 3) = 0;
    *(undefined4 *)(puVar4 + 5) = 0;
    *(undefined4 *)((long)puVar4 + 0x2c) = 0;
    *(undefined4 *)(puVar4 + 6) = 0;
    *(undefined4 *)((long)puVar4 + 0x34) = 0;
    *(undefined4 *)(puVar4 + 7) = 0;
    puVar4[8] = 0;
    puVar4[1] = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}